

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

field_metrics FIX::FieldBase::calculateMetrics(const_iterator start,const_iterator end)

{
  bool bVar1;
  byte *pbVar2;
  size_t length;
  field_metrics fVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  const_iterator str;
  const_iterator cStack_28;
  int checksum;
  const_iterator end_local;
  const_iterator start_local;
  undefined4 local_10;
  
  str._M_current._4_4_ = 0;
  local_38._M_current = start._M_current;
  cStack_28._M_current = end._M_current;
  end_local._M_current = start._M_current;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_38,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    pbVar2 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_38);
    str._M_current._4_4_ = (uint)*pbVar2 + str._M_current._4_4_;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_38);
  }
  length = std::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                     ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )end_local._M_current,
                      (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )cStack_28._M_current);
  field_metrics::field_metrics((field_metrics *)&start_local,length,str._M_current._4_4_);
  fVar3._12_4_ = 0;
  fVar3.m_length = (size_t)start_local._M_current;
  fVar3.m_checksum = local_10;
  return fVar3;
}

Assistant:

static field_metrics calculateMetrics( 
    std::string::const_iterator const start,
    std::string::const_iterator const end )
  {
    int checksum = 0;
    for ( std::string::const_iterator str = start; str != end; ++str )
      checksum += (unsigned char)( *str );

#if defined(__SUNPRO_CC)
    std::ptrdiff_t d;
    std::distance(start, end, d);
    return field_metrics( d, checksum );
#else
    return field_metrics( std::distance( start, end ), checksum );
#endif
  }